

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseString(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  string_view text;
  
  AdvanceCurrent(this);
  pcVar2 = this->m_current;
  pcVar3 = pcVar2;
  while ((((cVar1 = *pcVar3, cVar1 != '\0' && (pcVar3 <= this->m_end)) && (cVar1 != '\n')) &&
         (cVar1 != '\r'))) {
    if (cVar1 == '\"') {
      text._M_len = (long)pcVar3 - (long)pcVar2;
      text._M_str = pcVar2;
      CreateSymbolString(this,text);
      return;
    }
    AdvanceCurrent(this);
    pcVar3 = this->m_current;
  }
  Error<>(this,"Could not find matching quote");
  return;
}

Assistant:

inline_t void Lexer::ParseString()
	{
		// Advance past double quote character
		AdvanceCurrent();

		// Mark the start of the string
		const char * startName = m_current;

		// Check for matching end string token
		bool validString = false;
		while (!IsEndOfText())
		{
			if (IsNewline(*m_current))
				break;
			if (*m_current == '"')
			{
				validString = true;
				break;
			}
			AdvanceCurrent();
		}
		if (!validString)
		{
			Error("Could not find matching quote");
			return;
		}
		size_t count = m_current - startName;
		CreateSymbolString(std::string_view(startName, count));
	}